

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateUtils.cpp
# Opt level: O0

time_t ApprovalTests::DateUtils::toUtc(tm *timeinfo)

{
  time_t tVar1;
  tm *in_RDI;
  time_t tt;
  
  tVar1 = timegm(in_RDI);
  return tVar1;
}

Assistant:

time_t DateUtils::toUtc(std::tm& timeinfo)
    {
#ifdef _WIN32
        std::time_t tt = _mkgmtime(&timeinfo);
#else
        time_t tt = timegm(&timeinfo);
#endif
        return tt;
    }